

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O3

gint uc_exits_cmp(gconstpointer a,gconstpointer b,gpointer user_data)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*b <= *a) {
    uVar1 = (uint)(*a != *b);
  }
  return uVar1;
}

Assistant:

static gint uc_exits_cmp(gconstpointer a, gconstpointer b, gpointer user_data)
{
    uint64_t lhs = *((uint64_t *)a);
    uint64_t rhs = *((uint64_t *)b);

    if (lhs < rhs) {
        return -1;
    } else if (lhs == rhs) {
        return 0;
    } else {
        return 1;
    }
}